

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-mul-mat2.c
# Opt level: O0

void quantize_6_row(float *src,void *dst,int k)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined8 uVar17;
  undefined8 uVar18;
  undefined8 uVar19;
  undefined8 uVar20;
  undefined8 uVar21;
  undefined8 uVar22;
  undefined1 auVar23 [16];
  long lVar24;
  long lVar25;
  int in_EDX;
  long in_RSI;
  long in_RDI;
  int32_t vi_7;
  int32_t vi_6;
  int32_t vi_5;
  int32_t vi_4;
  int32_t vi_3;
  int32_t vi_2;
  int32_t vi_1;
  int32_t vi_0;
  __m256i vi;
  __m256 v;
  int l_4;
  __m256 idv;
  float id;
  float d;
  __m256 amaxv0_5;
  __m256 amaxv0_4;
  __m256 amaxv0_3;
  __m256 amaxv0_2;
  __m256 amaxv0_1;
  __m256 amaxv0_0;
  int l_3;
  int l_2;
  int l_1;
  int l;
  __m256 amaxv [4];
  __m256 asrcv [4];
  __m256 srcv [4];
  float amax;
  int i;
  uint8_t pp [16];
  uint8_t *pb;
  float *pd;
  int nb;
  undefined8 local_700;
  undefined8 uStack_6f8;
  undefined8 uStack_6f0;
  undefined8 uStack_6e8;
  int local_6a4;
  undefined8 local_660;
  undefined8 uStack_658;
  undefined8 uStack_650;
  undefined8 uStack_648;
  undefined8 local_640;
  undefined8 uStack_638;
  undefined8 uStack_630;
  undefined8 uStack_628;
  undefined8 local_620;
  undefined8 uStack_618;
  undefined8 uStack_610;
  undefined8 uStack_608;
  undefined8 local_600;
  undefined8 uStack_5f8;
  undefined8 uStack_5f0;
  undefined8 uStack_5e8;
  undefined8 local_5e0;
  undefined8 uStack_5d8;
  undefined8 uStack_5d0;
  undefined8 uStack_5c8;
  undefined8 local_5c0;
  undefined8 uStack_5b8;
  undefined8 uStack_5b0;
  undefined8 uStack_5a8;
  int local_590;
  int local_58c;
  int local_588;
  int local_584;
  undefined8 local_580 [16];
  undefined8 local_500 [35];
  float local_3e8;
  int local_3e4;
  undefined8 local_3e0;
  undefined8 local_3d8;
  long local_3d0;
  long local_3c8;
  int local_3c0;
  long local_3b8;
  long local_3b0;
  undefined8 *local_3a8;
  undefined8 local_3a0;
  undefined8 uStack_398;
  undefined8 uStack_390;
  undefined8 uStack_388;
  undefined8 local_380;
  undefined8 uStack_378;
  undefined8 uStack_370;
  undefined8 uStack_368;
  undefined8 local_360;
  undefined8 uStack_358;
  undefined8 uStack_350;
  undefined8 uStack_348;
  undefined8 local_340;
  undefined8 uStack_338;
  undefined8 uStack_330;
  undefined8 uStack_328;
  undefined8 local_320;
  undefined8 uStack_318;
  undefined8 uStack_310;
  undefined8 uStack_308;
  undefined8 local_300;
  undefined8 uStack_2f8;
  undefined8 uStack_2f0;
  undefined8 uStack_2e8;
  undefined8 local_2e0;
  undefined8 uStack_2d8;
  undefined8 uStack_2d0;
  undefined8 uStack_2c8;
  undefined8 local_2c0;
  undefined8 uStack_2b8;
  undefined8 uStack_2b0;
  undefined8 uStack_2a8;
  undefined8 local_2a0;
  undefined8 uStack_298;
  undefined8 uStack_290;
  undefined8 uStack_288;
  undefined8 local_280;
  undefined8 uStack_278;
  undefined8 uStack_270;
  undefined8 uStack_268;
  undefined8 local_260;
  undefined8 uStack_258;
  undefined8 uStack_250;
  undefined8 uStack_248;
  float local_224;
  undefined8 local_220;
  undefined8 uStack_218;
  undefined8 uStack_210;
  undefined8 uStack_208;
  undefined8 local_200;
  undefined8 uStack_1f8;
  undefined8 uStack_1f0;
  undefined8 uStack_1e8;
  undefined8 local_1e0;
  undefined8 uStack_1d8;
  undefined8 uStack_1d0;
  undefined8 uStack_1c8;
  undefined8 local_1c0;
  undefined8 uStack_1b8;
  undefined8 uStack_1b0;
  undefined8 uStack_1a8;
  undefined8 local_1a0;
  undefined8 uStack_198;
  undefined8 uStack_190;
  undefined8 uStack_188;
  undefined1 local_180 [16];
  undefined1 auStack_170 [16];
  undefined8 local_160;
  undefined8 uStack_158;
  undefined8 uStack_150;
  undefined8 uStack_148;
  undefined1 local_140 [16];
  undefined1 auStack_130 [16];
  undefined4 local_108;
  undefined4 local_104;
  undefined1 local_100 [32];
  float local_e0;
  float local_dc;
  float local_d8;
  float local_d4;
  float local_d0;
  float local_cc;
  float local_c8;
  float local_c4;
  undefined1 local_c0 [32];
  undefined4 local_a0;
  undefined4 local_9c;
  undefined4 local_98;
  undefined4 local_94;
  undefined4 local_90;
  undefined4 local_8c;
  undefined4 local_88;
  undefined4 local_84;
  undefined1 local_80 [16];
  undefined1 auStack_70 [16];
  undefined4 local_50;
  undefined4 local_4c;
  undefined4 local_48;
  undefined4 local_44;
  undefined4 local_40;
  undefined4 local_3c;
  undefined4 local_38;
  undefined4 local_34;
  
  if (in_EDX % 0x20 != 0) {
    __assert_fail("k % 32 == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/tests/test-mul-mat2.c"
                  ,0x7e2,"void quantize_6_row(const float *restrict, void *restrict, int)");
  }
  local_3b8 = in_RSI;
  local_3b0 = in_RDI;
  local_3c0 = quantize_6_blocks_per_row(in_EDX);
  local_3c8 = local_3b8;
  local_3d0 = local_3b8 + (long)local_3c0 * 4;
  local_3e4 = 0;
  do {
    if (local_3c0 <= local_3e4) {
      return;
    }
    memset(&local_3e0,0,0x10);
    local_3e8 = 0.0;
    for (local_584 = 0; local_584 < 4; local_584 = local_584 + 1) {
      local_3a8 = (undefined8 *)
                  (local_3b0 + (long)(local_3e4 << 5) * 4 + (long)(local_584 << 3) * 4);
      uVar6 = local_3a8[1];
      uVar7 = local_3a8[2];
      uVar8 = local_3a8[3];
      lVar24 = (long)local_584;
      local_500[lVar24 * 4 + 0x10] = *local_3a8;
      local_500[lVar24 * 4 + 0x11] = uVar6;
      local_500[lVar24 * 4 + 0x12] = uVar7;
      local_500[lVar24 * 4 + 0x13] = uVar8;
    }
    for (local_588 = 0; local_588 < 4; local_588 = local_588 + 1) {
      lVar24 = (long)local_588;
      local_104 = 0x7fffffff;
      local_84 = 0x7fffffff;
      local_88 = 0x7fffffff;
      local_8c = 0x7fffffff;
      local_90 = 0x7fffffff;
      local_94 = 0x7fffffff;
      local_98 = 0x7fffffff;
      local_9c = 0x7fffffff;
      local_a0 = 0x7fffffff;
      auVar1 = vpinsrd_avx(ZEXT416(0x7fffffff),0x7fffffff,1);
      auVar1 = vpinsrd_avx(auVar1,0x7fffffff,2);
      auVar1 = vpinsrd_avx(auVar1,0x7fffffff,3);
      auVar2 = vpinsrd_avx(ZEXT416(0x7fffffff),0x7fffffff,1);
      auVar2 = vpinsrd_avx(auVar2,0x7fffffff,2);
      auVar2 = vpinsrd_avx(auVar2,0x7fffffff,3);
      local_c0._0_16_ = ZEXT116(0) * auVar1 + ZEXT116(1) * auVar2;
      local_c0._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar1;
      auVar13 = local_c0;
      local_140 = local_c0._0_16_;
      auStack_130 = local_c0._16_16_;
      local_160 = local_500[lVar24 * 4 + 0x10];
      uStack_158 = local_500[lVar24 * 4 + 0x11];
      uStack_150 = local_500[lVar24 * 4 + 0x12];
      uStack_148 = local_500[lVar24 * 4 + 0x13];
      local_180 = local_c0._0_16_;
      auStack_170 = local_c0._16_16_;
      auVar4._8_8_ = local_500[lVar24 * 4 + 0x11];
      auVar4._0_8_ = local_500[lVar24 * 4 + 0x10];
      auVar4._16_8_ = local_500[lVar24 * 4 + 0x12];
      auVar4._24_8_ = local_500[lVar24 * 4 + 0x13];
      auVar5._16_8_ = local_c0._16_8_;
      auVar5._0_16_ = local_c0._0_16_;
      auVar5._24_8_ = local_c0._24_8_;
      auVar5 = vpand_avx2(auVar4,auVar5);
      local_c0 = auVar13;
      *(undefined1 (*) [32])(local_500 + (long)local_588 * 4) = auVar5;
    }
    for (local_58c = 0; local_58c < 2; local_58c = local_58c + 1) {
      lVar24 = (long)(local_58c << 1);
      lVar25 = (long)(local_58c * 2 + 1);
      local_280 = local_500[lVar24 * 4];
      uStack_278 = local_500[lVar24 * 4 + 1];
      uStack_270 = local_500[lVar24 * 4 + 2];
      uStack_268 = local_500[lVar24 * 4 + 3];
      local_2a0 = local_500[lVar25 * 4];
      uStack_298 = local_500[lVar25 * 4 + 1];
      uStack_290 = local_500[lVar25 * 4 + 2];
      uStack_288 = local_500[lVar25 * 4 + 3];
      auVar14._8_8_ = local_500[lVar24 * 4 + 1];
      auVar14._0_8_ = local_500[lVar24 * 4];
      auVar14._16_8_ = local_500[lVar24 * 4 + 2];
      auVar14._24_8_ = local_500[lVar24 * 4 + 3];
      auVar13._8_8_ = local_500[lVar25 * 4 + 1];
      auVar13._0_8_ = local_500[lVar25 * 4];
      auVar13._16_8_ = local_500[lVar25 * 4 + 2];
      auVar13._24_8_ = local_500[lVar25 * 4 + 3];
      auVar5 = vmaxps_avx(auVar14,auVar13);
      *(undefined1 (*) [32])(local_580 + (long)(local_58c << 1) * 4) = auVar5;
    }
    for (local_590 = 0; local_590 < 1; local_590 = local_590 + 1) {
      lVar24 = (long)(local_590 << 2);
      lVar25 = (long)(local_590 * 4 + 2);
      local_2c0 = local_580[lVar24 * 4];
      uStack_2b8 = local_580[lVar24 * 4 + 1];
      uStack_2b0 = local_580[lVar24 * 4 + 2];
      uStack_2a8 = local_580[lVar24 * 4 + 3];
      local_2e0 = local_580[lVar25 * 4];
      uStack_2d8 = local_580[lVar25 * 4 + 1];
      uStack_2d0 = local_580[lVar25 * 4 + 2];
      uStack_2c8 = local_580[lVar25 * 4 + 3];
      auVar12._8_8_ = local_580[lVar24 * 4 + 1];
      auVar12._0_8_ = local_580[lVar24 * 4];
      auVar12._16_8_ = local_580[lVar24 * 4 + 2];
      auVar12._24_8_ = local_580[lVar24 * 4 + 3];
      auVar11._8_8_ = local_580[lVar25 * 4 + 1];
      auVar11._0_8_ = local_580[lVar25 * 4];
      auVar11._16_8_ = local_580[lVar25 * 4 + 2];
      auVar11._24_8_ = local_580[lVar25 * 4 + 3];
      auVar5 = vmaxps_avx(auVar12,auVar11);
      *(undefined1 (*) [32])(local_580 + (long)(local_590 << 2) * 4) = auVar5;
    }
    auVar9._8_8_ = local_580[1];
    auVar9._0_8_ = local_580[0];
    auVar9._16_8_ = local_580[2];
    auVar9._24_8_ = local_580[3];
    auVar5 = vpermpd_avx2(auVar9,0x4e);
    local_5c0 = auVar5._0_8_;
    uStack_5b8 = auVar5._8_8_;
    uStack_5b0 = auVar5._16_8_;
    uStack_5a8 = auVar5._24_8_;
    local_300 = local_580[0];
    uStack_2f8 = local_580[1];
    uStack_2f0 = local_580[2];
    uStack_2e8 = local_580[3];
    local_320 = local_5c0;
    uStack_318 = uStack_5b8;
    uStack_310 = uStack_5b0;
    uStack_308 = uStack_5a8;
    auVar10._8_8_ = local_580[1];
    auVar10._0_8_ = local_580[0];
    auVar10._16_8_ = local_580[2];
    auVar10._24_8_ = local_580[3];
    auVar5 = vmaxps_avx(auVar10,auVar5);
    auVar4 = vpermilpd_avx(auVar5,5);
    local_5e0 = auVar5._0_8_;
    uStack_5d8 = auVar5._8_8_;
    uStack_5d0 = auVar5._16_8_;
    uStack_5c8 = auVar5._24_8_;
    local_600 = auVar4._0_8_;
    uStack_5f8 = auVar4._8_8_;
    uStack_5f0 = auVar4._16_8_;
    uStack_5e8 = auVar4._24_8_;
    local_340 = local_5e0;
    uStack_338 = uStack_5d8;
    uStack_330 = uStack_5d0;
    uStack_328 = uStack_5c8;
    local_360 = local_600;
    uStack_358 = uStack_5f8;
    uStack_350 = uStack_5f0;
    uStack_348 = uStack_5e8;
    auVar5 = vmaxps_avx(auVar5,auVar4);
    auVar4 = vpermilps_avx(auVar5,0xb1);
    local_620 = auVar5._0_8_;
    uStack_618 = auVar5._8_8_;
    uStack_610 = auVar5._16_8_;
    uStack_608 = auVar5._24_8_;
    local_640 = auVar4._0_8_;
    uStack_638 = auVar4._8_8_;
    uStack_630 = auVar4._16_8_;
    uStack_628 = auVar4._24_8_;
    local_380 = local_620;
    uStack_378 = uStack_618;
    uStack_370 = uStack_610;
    uStack_368 = uStack_608;
    local_3a0 = local_640;
    uStack_398 = uStack_638;
    uStack_390 = uStack_630;
    uStack_388 = uStack_628;
    auVar5 = vmaxps_avx(auVar5,auVar4);
    local_660 = auVar5._0_8_;
    uStack_658 = auVar5._8_8_;
    uStack_650 = auVar5._16_8_;
    uStack_648 = auVar5._24_8_;
    local_260 = local_660;
    uVar6 = local_260;
    uStack_258 = uStack_658;
    uStack_250 = uStack_650;
    uStack_248 = uStack_648;
    local_260._0_4_ = auVar5._0_4_;
    local_3e8 = (float)local_260;
    local_260._0_4_ = (float)local_260 / 7.0;
    if (((float)local_260 != 0.0) || (NAN((float)local_260))) {
      local_224 = 1.0 / (float)local_260;
    }
    else {
      local_224 = 0.0;
    }
    *(float *)(local_3c8 + (long)local_3e4 * 4) = (float)local_260;
    local_c4 = local_224;
    local_c8 = local_224;
    local_cc = local_224;
    local_d0 = local_224;
    local_d4 = local_224;
    local_d8 = local_224;
    local_dc = local_224;
    local_e0 = local_224;
    auVar1 = vinsertps_avx(ZEXT416((uint)local_224),ZEXT416((uint)local_224),0x10);
    auVar1 = vinsertps_avx(auVar1,ZEXT416((uint)local_224),0x20);
    auVar1 = vinsertps_avx(auVar1,ZEXT416((uint)local_224),0x30);
    auVar2 = vinsertps_avx(ZEXT416((uint)local_224),ZEXT416((uint)local_224),0x10);
    auVar2 = vinsertps_avx(auVar2,ZEXT416((uint)local_224),0x20);
    auVar2 = vinsertps_avx(auVar2,ZEXT416((uint)local_224),0x30);
    local_100._16_16_ = auVar1;
    local_100._0_16_ = auVar2;
    auVar5 = local_100;
    local_100._0_8_ = auVar2._0_8_;
    uVar7 = local_100._0_8_;
    local_100._8_8_ = auVar2._8_8_;
    uVar8 = local_100._8_8_;
    local_100._16_8_ = auVar1._0_8_;
    uVar17 = local_100._16_8_;
    local_100._24_8_ = auVar1._8_8_;
    uVar18 = local_100._24_8_;
    local_260 = uVar6;
    local_100 = auVar5;
    for (local_6a4 = 0; local_6a4 < 4; local_6a4 = local_6a4 + 1) {
      lVar24 = (long)local_6a4;
      local_200 = local_500[lVar24 * 4 + 0x10];
      uStack_1f8 = local_500[lVar24 * 4 + 0x11];
      uStack_1f0 = local_500[lVar24 * 4 + 0x12];
      uStack_1e8 = local_500[lVar24 * 4 + 0x13];
      uVar19 = local_200;
      uVar20 = uStack_1f8;
      uVar21 = uStack_1f0;
      uVar22 = uStack_1e8;
      local_220 = uVar7;
      uVar6 = local_220;
      uStack_218 = uVar8;
      uStack_210 = uVar17;
      uStack_208 = uVar18;
      local_200._4_4_ = (float)((ulong)local_200 >> 0x20);
      uStack_1f8._4_4_ = (float)((ulong)uStack_1f8 >> 0x20);
      uStack_1f0._4_4_ = (float)((ulong)uStack_1f0 >> 0x20);
      uStack_1e8._4_4_ = (undefined4)((ulong)uStack_1e8 >> 0x20);
      local_220._0_4_ = auVar2._0_4_;
      local_220._4_4_ = auVar2._4_4_;
      uStack_218._0_4_ = auVar2._8_4_;
      uStack_218._4_4_ = auVar2._12_4_;
      uStack_210._0_4_ = auVar1._0_4_;
      uStack_210._4_4_ = auVar1._4_4_;
      uStack_208._0_4_ = auVar1._8_4_;
      local_1e0 = CONCAT44(local_200._4_4_ * local_220._4_4_,(float)local_200 * (float)local_220);
      uStack_1d8 = CONCAT44(uStack_1f8._4_4_ * uStack_218._4_4_,
                            (float)uStack_1f8 * (float)uStack_218);
      uStack_1d0 = CONCAT44(uStack_1f0._4_4_ * uStack_210._4_4_,
                            (float)uStack_1f0 * (float)uStack_210);
      uStack_1c8 = CONCAT44(uStack_1e8._4_4_,(float)uStack_1e8 * (float)uStack_208);
      auVar15._8_8_ = uStack_1d8;
      auVar15._0_8_ = local_1e0;
      auVar15._16_8_ = uStack_1d0;
      auVar15._24_8_ = uStack_1c8;
      auVar5 = vcvtps2dq_avx(auVar15);
      local_700 = auVar5._0_8_;
      uStack_6f8 = auVar5._8_8_;
      uStack_6f0 = auVar5._16_8_;
      uStack_6e8 = auVar5._24_8_;
      local_108 = 8;
      local_34 = 8;
      local_38 = 8;
      local_3c = 8;
      local_40 = 8;
      local_44 = 8;
      local_48 = 8;
      local_4c = 8;
      local_50 = 8;
      auVar3 = vpinsrd_avx(ZEXT416(8),8,1);
      auVar3 = vpinsrd_avx(auVar3,8,2);
      local_80 = vpinsrd_avx(auVar3,8,3);
      auVar3 = vpinsrd_avx(ZEXT416(8),8,1);
      auVar3 = vpinsrd_avx(auVar3,8,2);
      auStack_70 = vpinsrd_avx(auVar3,8,3);
      auVar23 = auStack_70;
      auVar3 = local_80;
      local_1a0 = local_700;
      uStack_198 = uStack_6f8;
      uStack_190 = uStack_6f0;
      uStack_188 = uStack_6e8;
      local_1c0 = local_80._0_8_;
      uStack_1b8 = local_80._8_8_;
      uStack_1b0 = auStack_70._0_8_;
      uStack_1a8 = auStack_70._8_8_;
      auVar16._16_8_ = auStack_70._0_8_;
      auVar16._0_16_ = local_80;
      auVar16._24_8_ = auStack_70._8_8_;
      auVar5 = vpaddd_avx2(auVar5,auVar16);
      local_700._0_4_ = auVar5._0_4_;
      local_700._4_4_ = auVar5._4_4_;
      uStack_6f8._0_4_ = auVar5._8_4_;
      uStack_6f8._4_4_ = auVar5._12_4_;
      uStack_6f0._0_4_ = auVar5._16_4_;
      uStack_6f0._4_4_ = auVar5._20_4_;
      uStack_6e8._0_4_ = auVar5._24_4_;
      uStack_6e8._4_4_ = auVar5._28_4_;
      local_220 = uVar6;
      uStack_218 = uVar8;
      uStack_210 = uVar17;
      uStack_208 = uVar18;
      local_200 = uVar19;
      uStack_1f8 = uVar20;
      uStack_1f0 = uVar21;
      uStack_1e8 = uVar22;
      local_80 = auVar3;
      auStack_70 = auVar23;
      *(byte *)((long)&local_3e0 + (long)(local_6a4 << 2)) =
           auVar5[0] | (byte)(local_700._4_4_ << 4);
      *(byte *)((long)&local_3e0 + (long)(local_6a4 * 4 + 1)) =
           auVar5[8] | (byte)(uStack_6f8._4_4_ << 4);
      *(byte *)((long)&local_3e0 + (long)(local_6a4 * 4 + 2)) =
           auVar5[0x10] | (byte)(uStack_6f0._4_4_ << 4);
      *(byte *)((long)&local_3e0 + (long)(local_6a4 * 4 + 3)) =
           auVar5[0x18] | (byte)(uStack_6e8._4_4_ << 4);
      if (((int)local_700 < 0) || (0xf < (int)local_700)) {
        __assert_fail("vi_0 >= 0 && vi_0 < 16",
                      "/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/tests/test-mul-mat2.c"
                      ,0x830,"void quantize_6_row(const float *restrict, void *restrict, int)");
      }
      if ((local_700._4_4_ < 0) || (0xf < local_700._4_4_)) {
        __assert_fail("vi_1 >= 0 && vi_1 < 16",
                      "/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/tests/test-mul-mat2.c"
                      ,0x831,"void quantize_6_row(const float *restrict, void *restrict, int)");
      }
      if (((int)uStack_6f8 < 0) || (0xf < (int)uStack_6f8)) {
        __assert_fail("vi_2 >= 0 && vi_2 < 16",
                      "/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/tests/test-mul-mat2.c"
                      ,0x832,"void quantize_6_row(const float *restrict, void *restrict, int)");
      }
      if ((uStack_6f8._4_4_ < 0) || (0xf < uStack_6f8._4_4_)) {
        __assert_fail("vi_3 >= 0 && vi_3 < 16",
                      "/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/tests/test-mul-mat2.c"
                      ,0x833,"void quantize_6_row(const float *restrict, void *restrict, int)");
      }
      if (((int)uStack_6f0 < 0) || (0xf < (int)uStack_6f0)) {
        __assert_fail("vi_4 >= 0 && vi_4 < 16",
                      "/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/tests/test-mul-mat2.c"
                      ,0x835,"void quantize_6_row(const float *restrict, void *restrict, int)");
      }
      if ((uStack_6f0._4_4_ < 0) || (0xf < uStack_6f0._4_4_)) {
        __assert_fail("vi_5 >= 0 && vi_5 < 16",
                      "/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/tests/test-mul-mat2.c"
                      ,0x836,"void quantize_6_row(const float *restrict, void *restrict, int)");
      }
      if (((int)uStack_6e8 < 0) || (0xf < (int)uStack_6e8)) {
        __assert_fail("vi_6 >= 0 && vi_6 < 16",
                      "/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/tests/test-mul-mat2.c"
                      ,0x837,"void quantize_6_row(const float *restrict, void *restrict, int)");
      }
      if ((uStack_6e8._4_4_ < 0) || (0xf < uStack_6e8._4_4_)) {
        __assert_fail("vi_7 >= 0 && vi_7 < 16",
                      "/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/tests/test-mul-mat2.c"
                      ,0x838,"void quantize_6_row(const float *restrict, void *restrict, int)");
      }
    }
    *(undefined8 *)(local_3d0 + (local_3e4 << 4)) = local_3e0;
    *(undefined8 *)(local_3d0 + 8 + (long)(local_3e4 << 4)) = local_3d8;
    local_3e4 = local_3e4 + 1;
  } while( true );
}

Assistant:

void quantize_6_row(const float * restrict src, void * restrict dst, int k) {
    assert(k % 32 == 0);
    assert(QB == 4);

    const int nb = quantize_6_blocks_per_row(k);

    gq_scale_t * restrict pd = (gq_scale_t *) (dst);
    uint8_t    * restrict pb = (uint8_t *)    (pd + nb);

    uint8_t pp[16];

    for (int i = 0; i < nb; i++) {
        memset(pp, 0, sizeof(pp));

        float amax = 0.0f; // absolute max

#if defined(__AVX2__)
        {
            enum { QK8 = 4 };

            __m256 srcv [QK8];
            __m256 asrcv[QK8];
            __m256 amaxv[QK8];

            for (int l = 0; l < QK8; l++) {
                srcv[l]  = _mm256_loadu_ps(src + i*32 + 8*l);
            }

            for (int l = 0; l < QK8; l++) {
                asrcv[l] = _mm256_and_ps(srcv[l], _mm256_castsi256_ps(_mm256_set1_epi32(0x7fffffff)));
            }

            for (int l = 0; l < QK8/2; l++) {
                amaxv[2*l] = _mm256_max_ps(asrcv[2*l], asrcv[2*l+1]);
            }

            for (int l = 0; l < QK8/4; l++) {
                amaxv[4*l] = _mm256_max_ps(amaxv[4*l], amaxv[4*l+2]);
            }

            const __m256 amaxv0_0 = _mm256_permute2f128_ps(amaxv[0], amaxv[0], 3);
            const __m256 amaxv0_1 = _mm256_max_ps(amaxv[0], amaxv0_0);
            const __m256 amaxv0_2 = _mm256_permute_ps(amaxv0_1, 0x4e);
            const __m256 amaxv0_3 = _mm256_max_ps(amaxv0_1, amaxv0_2);
            const __m256 amaxv0_4 = _mm256_permute_ps(amaxv0_3, 0xb1);
            const __m256 amaxv0_5 = _mm256_max_ps(amaxv0_3, amaxv0_4);

            amax = _mm256_cvtss_f32(amaxv0_5);

            const float d = amax / ((1 << (QB - 1)) - 1);
            const float id = d ? 1.0/d : 0.0;

            pd[i] = GGML_FP32_TO_GQ(d);

            const __m256 idv = _mm256_set1_ps(id);

            for (int l = 0; l < 4; l++) {
                __m256 v = _mm256_mul_ps(srcv[l], idv);

                // convert to int8
                __m256i vi = _mm256_cvtps_epi32(v);
                vi = _mm256_add_epi32(vi, _mm256_set1_epi32(8));

                int32_t vi_0 = _mm256_extract_epi32(vi, 0);
                int32_t vi_1 = _mm256_extract_epi32(vi, 1);
                int32_t vi_2 = _mm256_extract_epi32(vi, 2);
                int32_t vi_3 = _mm256_extract_epi32(vi, 3);

                int32_t vi_4 = _mm256_extract_epi32(vi, 4);
                int32_t vi_5 = _mm256_extract_epi32(vi, 5);
                int32_t vi_6 = _mm256_extract_epi32(vi, 6);
                int32_t vi_7 = _mm256_extract_epi32(vi, 7);

                // convert to 4-bit, 2 consecutive packed into 1 byte
                pp[4*l + 0] = vi_0 | (vi_1 << 4);
                pp[4*l + 1] = vi_2 | (vi_3 << 4);
                pp[4*l + 2] = vi_4 | (vi_5 << 4);
                pp[4*l + 3] = vi_6 | (vi_7 << 4);

                assert(vi_0 >= 0 && vi_0 < 16);
                assert(vi_1 >= 0 && vi_1 < 16);
                assert(vi_2 >= 0 && vi_2 < 16);
                assert(vi_3 >= 0 && vi_3 < 16);

                assert(vi_4 >= 0 && vi_4 < 16);
                assert(vi_5 >= 0 && vi_5 < 16);
                assert(vi_6 >= 0 && vi_6 < 16);
                assert(vi_7 >= 0 && vi_7 < 16);
            }

            memcpy(pb + i*16, pp, sizeof(pp));
        }
#elif defined(__ARM_NEON)
        {
            float32x4_t srcv [8];
            float32x4_t asrcv[8];
            float32x4_t amaxv[8];

            for (int l = 0; l < 8; l++) srcv[l]  = vld1q_f32(src + i*32 + 4*l);
            for (int l = 0; l < 8; l++) asrcv[l] = vabsq_f32(srcv[l]);

            for (int l = 0; l < 4; l++) amaxv[2*l] = vmaxq_f32(asrcv[2*l], asrcv[2*l+1]);
            for (int l = 0; l < 2; l++) amaxv[4*l] = vmaxq_f32(amaxv[4*l], amaxv[4*l+2]);
            for (int l = 0; l < 1; l++) amaxv[8*l] = vmaxq_f32(amaxv[8*l], amaxv[8*l+4]);

            amax = MAX(
                    MAX(vgetq_lane_f32(amaxv[0], 0), vgetq_lane_f32(amaxv[0], 1)),
                    MAX(vgetq_lane_f32(amaxv[0], 2), vgetq_lane_f32(amaxv[0], 3)));

            const float d = amax / ((1 << 3) - 1);
            const float id = d ? 1.0/d : 0.0;

            pd[i] = GGML_FP32_TO_GQ(d);

            for (int l = 0; l < 8; l++) {
                const float32x4_t v = vmulq_n_f32(srcv[l], id);
                const float32x4_t vf = vaddq_f32(v, vdupq_n_f32(8.5f));
                const int32x4_t vi = vcvtq_s32_f32(vf);

                pp[2*l + 0] = vgetq_lane_s32(vi, 0) | (vgetq_lane_s32(vi, 1) << 4);
                pp[2*l + 1] = vgetq_lane_s32(vi, 2) | (vgetq_lane_s32(vi, 3) << 4);
            }

            memcpy(pb + i*16, pp, sizeof(pp));
        }
#else
        {
            for (int l = 0; l < 32; l++) {
                const float v = src[i*32 + l];
                amax = MAX(amax, fabsf(v));
            }

            const float d = amax / ((1 << (QB - 1)) - 1);
            const float id = d ? 1.0/d : 0.0;

            pd[i] = GGML_FP32_TO_GQ(d);

            for (int l = 0; l < 32; l++) {
                const float v = src[i*32 + l]*id;
                const int8_t vi = ((int8_t) (round(v))) + 8;
                assert(vi >= 0 && vi < 16);
                pp[l/2] |= (vi & 0xf) << (4*(l & 1));
            }

            memcpy(pb + i*16, pp, sizeof(pp));
        }
#endif
        //printf("amax = %f\n", amax);
    }
}